

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::emitDelegate(BinaryInstWriter *this,Try *curr)

{
  pointer pNVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  int32_t iVar2;
  undefined8 in_RAX;
  size_t in_RCX;
  void *__buf;
  uchar *__args;
  Name name;
  undefined7 local_28;
  uchar local_21;
  
  pNVar1 = (this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start != pNVar1) {
    (this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = pNVar1 + -1;
    this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    __args = &local_21;
    _local_28 = CONCAT17(0x18,(int7)in_RAX);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,__args);
    name.super_IString.str._M_str = (curr->delegateTarget).super_IString.str._M_str;
    name.super_IString.str._M_len = (size_t)__args;
    iVar2 = getBreakIndex(this,name);
    _local_28 = CONCAT44(stack0xffffffffffffffdc,iVar2);
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)&local_28,(int)this_00,__buf,in_RCX);
    return;
  }
  __assert_fail("!breakStack.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                ,0x881,"void wasm::BinaryInstWriter::emitDelegate(Try *)");
}

Assistant:

void BinaryInstWriter::emitDelegate(Try* curr) {
  // The delegate ends the scope in effect, and pops the try's name. Note that
  // the getBreakIndex is intentionally after that pop, as the delegate cannot
  // target its own try.
  assert(!breakStack.empty());
  breakStack.pop_back();
  o << int8_t(BinaryConsts::Delegate)
    << U32LEB(getBreakIndex(curr->delegateTarget));
}